

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileSystem.cpp
# Opt level: O2

string * __thiscall
Diligent::BasicFileSystem::SimplifyPath_abi_cxx11_
          (string *__return_storage_ptr__,BasicFileSystem *this,Char *Path,Char Slash)

{
  BasicFileSystem BVar1;
  pointer pMVar2;
  pointer this_00;
  char cVar3;
  bool bVar4;
  int iVar5;
  const_iterator __begin1;
  BasicFileSystem *pBVar6;
  pointer pMVar7;
  pointer pMVar8;
  pointer pMVar9;
  pointer pMVar10;
  char cVar11;
  char (*Args_1) [31];
  size_t __n;
  char *pcVar12;
  BasicFileSystem *pBVar13;
  _Vector_base<MiniStringView,_std::allocator<MiniStringView>_> *this_01;
  pointer pMVar14;
  const_iterator __end1;
  pointer pMVar15;
  long lVar16;
  char cVar17;
  long lVar18;
  ulong uVar19;
  char **ppcVar20;
  vector<MiniStringView,_std::allocator<MiniStringView>_> local_88;
  pointer local_68;
  BasicFileSystem *local_60;
  size_t local_58;
  string msg;
  
  if (this == (BasicFileSystem *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&msg);
    return __return_storage_ptr__;
  }
  cVar17 = (char)Path;
  pBVar13 = this;
  if (cVar17 == '\0') {
    cVar17 = '/';
  }
  else if ((cVar17 != '/') && (cVar17 != '\\')) {
    FormatString<char[23]>(&msg,(char (*) [23])"Incorrect slash symbol");
    pcVar12 = "SimplifyPath";
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SimplifyPath",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Basic/src/BasicFileSystem.cpp"
               ,0xea);
    std::__cxx11::string::~string((string *)&msg);
    pBVar13 = (BasicFileSystem *)pcVar12;
  }
  local_88.super__Vector_base<MiniStringView,_std::allocator<MiniStringView>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<MiniStringView,_std::allocator<MiniStringView>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<MiniStringView,_std::allocator<MiniStringView>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pBVar6 = this + 1;
  this_01 = (_Vector_base<MiniStringView,_std::allocator<MiniStringView>_> *)0x1;
  do {
    BVar1 = pBVar6[-1];
    if ((BVar1 == (BasicFileSystem)0x2f) || (BVar1 == (BasicFileSystem)0x5c)) {
      this_01 = (_Vector_base<MiniStringView,_std::allocator<MiniStringView>_> *)
                ((long)&(this_01->_M_impl).super__Vector_impl_data._M_start +
                (ulong)(*pBVar6 != (BasicFileSystem)0x5c && *pBVar6 != (BasicFileSystem)0x2f));
    }
    else if (BVar1 == (BasicFileSystem)0x0) goto LAB_00616b0e;
    pBVar6 = pBVar6 + 1;
  } while( true );
code_r0x00616bd4:
  this = (BasicFileSystem *)((long)&pMVar10->Start + 1);
  pMVar9 = local_88.super__Vector_base<MiniStringView,_std::allocator<MiniStringView>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (cVar3 != '.') {
LAB_00616c87:
    this = (BasicFileSystem *)((long)&pMVar10->Start + lVar18);
    if (pMVar15 == pMVar8) {
      lVar18 = (long)pMVar15 - (long)this_00;
      local_88.super__Vector_base<MiniStringView,_std::allocator<MiniStringView>_>._M_impl.
      super__Vector_impl_data._M_finish = pMVar14;
      if (lVar18 == 0x7ffffffffffffff0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      pMVar14 = (pointer)(lVar18 >> 4);
      pMVar8 = pMVar14;
      if (pMVar15 == this_00) {
        pMVar8 = (pointer)0x1;
      }
      local_68 = (pointer)((long)&pMVar14->Start + (long)&pMVar8->Start);
      if ((pointer)0x7fffffffffffffe < local_68) {
        local_68 = (pointer)0x7ffffffffffffff;
      }
      if (CARRY8((ulong)pMVar8,(ulong)pMVar14)) {
        local_68 = (pointer)0x7ffffffffffffff;
      }
      pMVar9 = std::_Vector_base<MiniStringView,_std::allocator<MiniStringView>_>::_M_allocate
                         ((_Vector_base<MiniStringView,_std::allocator<MiniStringView>_> *)local_68,
                          0x7ffffffffffffff0);
      *(pointer *)((long)pMVar9 + lVar18) = pMVar10;
      *(BasicFileSystem **)((long)pMVar9 + lVar18 + 8) = this;
      pMVar8 = pMVar9;
      for (pMVar10 = this_00; pMVar7 = pMVar8 + 1, pMVar10 != pMVar15; pMVar10 = pMVar10 + 1) {
        pMVar2 = (pointer)pMVar10->End;
        pMVar8->Start =
             (char *)(((_Vector_impl *)&pMVar10->Start)->super__Vector_impl_data)._M_start;
        pMVar8->End = (char *)pMVar2;
        pMVar8 = pMVar7;
      }
      std::_Vector_base<MiniStringView,_std::allocator<MiniStringView>_>::_M_deallocate
                ((_Vector_base<MiniStringView,_std::allocator<MiniStringView>_> *)this_00,pMVar14,
                 __n);
      local_88.super__Vector_base<MiniStringView,_std::allocator<MiniStringView>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pMVar9 + (long)local_68;
      this_00 = pMVar9;
      pMVar8 = local_88.super__Vector_base<MiniStringView,_std::allocator<MiniStringView>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      local_88.super__Vector_base<MiniStringView,_std::allocator<MiniStringView>_>._M_impl.
      super__Vector_impl_data._M_finish = pMVar7;
      pMVar15 = pMVar7;
    }
    else {
      pMVar15->Start = (char *)pMVar10;
      pMVar15->End = (char *)this;
      pMVar7 = pMVar15 + 1;
LAB_00616c9f:
      this = (BasicFileSystem *)((long)&pMVar10->Start + lVar18);
      pMVar9 = local_88.super__Vector_base<MiniStringView,_std::allocator<MiniStringView>_>._M_impl.
               super__Vector_impl_data._M_start;
      pMVar15 = pMVar7;
    }
  }
  goto LAB_00616b85;
LAB_00616b0e:
  if ((ulong)this_01 >> 0x3b != 0) {
    std::__throw_length_error("vector::reserve");
  }
  this_00 = local_88.super__Vector_base<MiniStringView,_std::allocator<MiniStringView>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pMVar8 = local_88.super__Vector_base<MiniStringView,_std::allocator<MiniStringView>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_60 = this;
  pMVar9 = local_88.super__Vector_base<MiniStringView,_std::allocator<MiniStringView>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pMVar15 = local_88.super__Vector_base<MiniStringView,_std::allocator<MiniStringView>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (this_01 != (_Vector_base<MiniStringView,_std::allocator<MiniStringView>_> *)0x0) {
    local_88.super__Vector_base<MiniStringView,_std::allocator<MiniStringView>_>._M_impl.
    super__Vector_impl_data._M_finish =
         std::_Vector_base<MiniStringView,_std::allocator<MiniStringView>_>::_M_allocate
                   (this_01,(size_t)pBVar13);
    local_88.super__Vector_base<MiniStringView,_std::allocator<MiniStringView>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_88.super__Vector_base<MiniStringView,_std::allocator<MiniStringView>_>._M_impl.
         super__Vector_impl_data._M_finish + (long)this_01;
    this_00 = local_88.super__Vector_base<MiniStringView,_std::allocator<MiniStringView>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pMVar8 = local_88.super__Vector_base<MiniStringView,_std::allocator<MiniStringView>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pMVar9 = local_88.super__Vector_base<MiniStringView,_std::allocator<MiniStringView>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pMVar15 = local_88.super__Vector_base<MiniStringView,_std::allocator<MiniStringView>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
LAB_00616b85:
  local_88.super__Vector_base<MiniStringView,_std::allocator<MiniStringView>_>._M_impl.
  super__Vector_impl_data._M_start = pMVar9;
  cVar3 = *(char *)&((pointer)this)->Start;
  pMVar10 = (pointer)this;
  if (cVar3 != '\0') {
    while ((cVar3 == '/' || (cVar3 == '\\'))) {
      cVar3 = *(char *)((long)&pMVar10->Start + 1);
      pMVar10 = (pointer)((long)&pMVar10->Start + 1);
    }
    if (cVar3 != '\0') {
      lVar18 = 0;
      cVar11 = cVar3;
      while (((cVar11 != '\0' && (cVar11 != '/')) && (cVar11 != '\\'))) {
        lVar16 = lVar18 + 1;
        lVar18 = lVar18 + 1;
        cVar11 = *(char *)((long)&pMVar10->Start + lVar16);
      }
      pMVar14 = pMVar15;
      if (lVar18 == 1) goto code_r0x00616bd4;
      if (((lVar18 != 2) || (cVar3 != '.')) ||
         ((*(char *)((long)&pMVar10->Start + 1) != '.' || (this_00 == pMVar15)))) goto LAB_00616c87;
      pMVar7 = pMVar15 + -1;
      local_58 = (long)pMVar15[-1].End - (long)pMVar15[-1].Start;
      local_68 = pMVar15;
      iVar5 = strncmp("..",pMVar15[-1].Start,local_58);
      if ((iVar5 == 0) && (pMVar14 = local_68, ".."[local_58] == '\0')) goto LAB_00616c87;
      goto LAB_00616c9f;
    }
  }
  if (cVar17 == '/') {
    bVar4 = *local_60 == (BasicFileSystem)0x5c || *local_60 == (BasicFileSystem)0x2f;
  }
  else {
    bVar4 = false;
  }
  lVar18 = (long)pMVar15 - (long)this_00 >> 4;
  local_60 = (BasicFileSystem *)(ulong)bVar4;
  uVar19 = (ulong)local_60;
  for (pMVar8 = this_00; pMVar8 != pMVar15; pMVar8 = pMVar8 + 1) {
    uVar19 = (long)pMVar8->End +
             (uVar19 - (long)(((_Vector_impl *)&pMVar8->Start)->super__Vector_impl_data)._M_start);
  }
  Args_1 = (char (*) [31])0x0;
  if (pMVar15 != this_00) {
    Args_1 = (char (*) [31])(lVar18 + -1);
  }
  pcVar12 = *Args_1;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_88.super__Vector_base<MiniStringView,_std::allocator<MiniStringView>_>._M_impl.
  super__Vector_impl_data._M_finish = pMVar15;
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (local_60 != (BasicFileSystem *)0x0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  ppcVar20 = &this_00->End;
  for (lVar16 = 0; lVar18 != lVar16; lVar16 = lVar16 + 1) {
    if (lVar16 != 0) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    std::__cxx11::string::append<char_const*,void>
              ((string *)__return_storage_ptr__,((MiniStringView *)(ppcVar20 + -1))->Start,*ppcVar20
              );
    ppcVar20 = ppcVar20 + 2;
  }
  if ((char *)__return_storage_ptr__->_M_string_length != pcVar12 + uVar19) {
    FormatString<char[26],char[31]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"SimplifiedPath.length() == Len",Args_1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SimplifyPath",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Basic/src/BasicFileSystem.cpp"
               ,0x11b);
    std::__cxx11::string::~string((string *)&msg);
  }
  std::vector<MiniStringView,_std::allocator<MiniStringView>_>::~vector(&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string BasicFileSystem::SimplifyPath(const Char* Path, Char Slash)
{
    if (Path == nullptr)
        return "";

    if (Slash != 0)
        DEV_CHECK_ERR(IsSlash(Slash), "Incorrect slash symbol");
    else
        Slash = SlashSymbol;

    struct MiniStringView
    {
        MiniStringView(const char* _Start,
                       const char* _End) :
            Start{_Start},
            End{_End}
        {}

        bool operator==(const char* Str) const noexcept
        {
            const auto Len = End - Start;
            return strncmp(Str, Start, Len) == 0 && Str[Len] == '\0';
        }

        bool operator!=(const char* str) const noexcept
        {
            return !(*this == str);
        }

        const char* const Start;
        const char* const End;
    };

    const auto PathComponents  = Diligent::SplitPath<MiniStringView>(Path, true);
    const auto NumComponents   = PathComponents.size();
    const auto UseLeadingSlash = Slash == '/' && IsSlash(Path[0]);

    size_t Len = UseLeadingSlash ? 1 : 0;
    for (const auto& Cmp : PathComponents)
        Len += Cmp.End - Cmp.Start;
    if (NumComponents > 0)
        Len += NumComponents - 1;

    std::string SimplifiedPath;
    SimplifiedPath.reserve(Len);
    if (UseLeadingSlash)
        SimplifiedPath.push_back(Slash);

    for (size_t i = 0; i < NumComponents; ++i)
    {
        if (i > 0)
            SimplifiedPath.push_back(Slash);
        const auto& Cmp = PathComponents[i];
        SimplifiedPath.append(Cmp.Start, Cmp.End);
    }
    VERIFY_EXPR(SimplifiedPath.length() == Len);

    return SimplifiedPath;
}